

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_vdpu2.c
# Opt level: O0

MPP_RET jpegd_gen_regs(JpegdHalCtx *ctx,JpegdSyntax *syntax)

{
  void *pvVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  RockchipSocType RVar5;
  RK_U32 offset;
  uint local_6c;
  RK_U32 table_fd;
  RK_U8 start_byte;
  RK_U32 hw_strm_offset;
  RK_U32 strm_offset;
  RK_U32 uv_hor_virstride;
  RK_U32 y_virstride;
  RK_U32 y_hor_stride;
  RK_U32 out_height;
  RK_U32 out_width;
  JpegRegSet_conflict1 *regs;
  JpegdSyntax *s;
  MPP_RET ret;
  JpegdSyntax *syntax_local;
  JpegdHalCtx *ctx_local;
  
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpegd_rkv","enter\n","jpegd_gen_regs");
  }
  pvVar1 = ctx->regs;
  *(uint *)((long)pvVar1 + 4) = *(uint *)((long)pvVar1 + 4) & 0xfffffffe | 1;
  *(uint *)((long)pvVar1 + 4) = *(uint *)((long)pvVar1 + 4) & 0xfffffffb | 4;
  *(uint *)((long)pvVar1 + 4) = *(uint *)((long)pvVar1 + 4) & 0xfffffff7 | 8;
  *(uint *)((long)pvVar1 + 0xc) =
       *(uint *)((long)pvVar1 + 0xc) & 0xffff0000 | syntax->width - 1 & 0xffff;
  *(uint *)((long)pvVar1 + 0xc) =
       *(uint *)((long)pvVar1 + 0xc) & 0xffff | (syntax->height - 1) * 0x10000;
  if ((syntax->sample_precision == '\b') && (syntax->qtbl_entry < 4)) {
    *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xffffff8f;
    if (syntax->nb_components == 1) {
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xffffcfff | 0x1000;
    }
    if (syntax->nb_components < 2) {
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xfffffcff | 0x100;
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xffffcfff | 0x1000;
    }
    else {
      iVar4 = 2;
      if (1 < syntax->qtbl_entry) {
        iVar4 = 3;
      }
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xfffffcff | iVar4 << 8;
      iVar4 = 2;
      if (0xf < syntax->htbl_entry) {
        iVar4 = 3;
      }
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xffffcfff | iVar4 << 0xc;
    }
    if (syntax->restart_interval != 0) {
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xffff7fff | 0x8000;
      *(uint *)((long)pvVar1 + 0x10) =
           *(uint *)((long)pvVar1 + 0x10) & 0xffff | (syntax->restart_interval - 1) * 0x10000;
    }
    switch(syntax->yuv_mode) {
    case 0:
    case 2:
    case 3:
      *(uint *)((long)pvVar1 + 0x10) =
           *(uint *)((long)pvVar1 + 0x10) & 0xfffffff8 | syntax->yuv_mode & 7;
      break;
    default:
      _mpp_log_l(2,"hal_jpegd_rkv","unsupported yuv mode %d\n","jpegd_gen_regs",
                 (ulong)syntax->yuv_mode);
      break;
    case 4:
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xfffffff8 | 5;
      break;
    case 5:
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xfffffff8 | 4;
      break;
    case 6:
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xfffffff8 | 1;
    }
    uVar2 = ((syntax->width + 0xf & 0xfffffff0) >> ((byte)(*(uint *)((long)pvVar1 + 8) >> 0xc) & 3))
            + 0xf;
    if ((*(uint *)((long)pvVar1 + 8) >> 0x18 & 1) == 0) {
      local_6c = syntax->height + 7 & 0xfffffff8;
    }
    else {
      local_6c = syntax->height + 0xf & 0xfffffff0;
    }
    local_6c = local_6c >> ((byte)(*(uint *)((long)pvVar1 + 8) >> 0xc) & 3);
    if ((jpegd_debug & 0x80) != 0) {
      _mpp_log_l(4,"hal_jpegd_rkv","output scale %d, width %d, height %d\n",(char *)0x0,
                 (ulong)(*(uint *)((long)pvVar1 + 8) >> 0xc & 3),(ulong)(uVar2 & 0xfffffff0),
                 local_6c);
    }
    uv_hor_virstride = uVar2 >> 4;
    hw_strm_offset = 0;
    switch(*(uint *)((long)pvVar1 + 8) >> 0x1b & 7) {
    case 0:
      uVar3 = *(uint *)((long)pvVar1 + 0x10) & 7;
      if (uVar3 == 0) {
        hw_strm_offset = 0;
      }
      else if (uVar3 == 1) {
        hw_strm_offset = uVar2 >> 5;
      }
      else {
        hw_strm_offset = uv_hor_virstride;
        if (uVar3 == 4 || uVar3 == 5) {
          hw_strm_offset = uv_hor_virstride << 1;
        }
      }
      break;
    case 1:
      uv_hor_virstride = uv_hor_virstride * 3;
      break;
    case 2:
    case 4:
      uv_hor_virstride = uv_hor_virstride << 1;
      break;
    case 3:
      hw_strm_offset = uv_hor_virstride;
    }
    iVar4 = uv_hor_virstride * local_6c;
    if ((*(uint *)((long)pvVar1 + 8) >> 0x1a & 1) == 1) {
      RVar5 = mpp_get_soc_type();
      if (RVar5 < ROCKCHIP_SOC_RK3576) {
        uv_hor_virstride = uv_hor_virstride << 3;
        hw_strm_offset = hw_strm_offset << 3;
      }
      else {
        uVar2 = *(uint *)((long)pvVar1 + 8) >> 0x1b & 7;
        if (uVar2 == 0) {
          switch(*(uint *)((long)pvVar1 + 0x10) & 7) {
          case 0:
            uv_hor_virstride = uv_hor_virstride << 2;
            break;
          case 1:
          case 2:
            uv_hor_virstride = uv_hor_virstride * 0xc >> 1;
            break;
          case 3:
          case 4:
            uv_hor_virstride = uv_hor_virstride << 3;
            break;
          case 5:
            uv_hor_virstride = uv_hor_virstride * 0xc;
            break;
          default:
            return MPP_NOK;
          }
        }
        else if (uVar2 == 3) {
          uv_hor_virstride = uv_hor_virstride * 0xc >> 1;
        }
        else if (uVar2 == 4) {
          uv_hor_virstride = uv_hor_virstride << 3;
        }
        hw_strm_offset = 0;
      }
    }
    *(uint *)((long)pvVar1 + 0x14) =
         *(uint *)((long)pvVar1 + 0x14) & 0xffff0000 | uv_hor_virstride & 0xffff;
    *(uint *)((long)pvVar1 + 0x14) =
         *(uint *)((long)pvVar1 + 0x14) & 0xffff | hw_strm_offset << 0x10;
    *(uint *)((long)pvVar1 + 0x18) = *(uint *)((long)pvVar1 + 0x18) & 0xf | iVar4 * 0x10;
    *(uint *)((long)pvVar1 + 0x1c) =
         *(uint *)((long)pvVar1 + 0x1c) & 0xfeffffff | (uv_hor_virstride >> 0x10 & 1) << 0x18;
    if (syntax->qtable_cnt == '\0') {
      *(uint *)((long)pvVar1 + 0x1c) = *(uint *)((long)pvVar1 + 0x1c) & 0xffffffe0;
    }
    else {
      *(uint *)((long)pvVar1 + 0x1c) =
           *(uint *)((long)pvVar1 + 0x1c) & 0xffffffe0 |
           (*(uint *)((long)pvVar1 + 0x10) >> 8 & 3) * 8 - 1 & 0x1f;
    }
    *(uint *)((long)pvVar1 + 0x1c) =
         *(uint *)((long)pvVar1 + 0x1c) & 0xffc0ffff |
         ((*(uint *)((long)pvVar1 + 0x10) >> 0xc & 3) *
          ((uint)((*(uint *)((long)pvVar1 + 0x10) >> 4 & 7) != 0) * 4 + 0xc) - 1 & 0x3f) << 0x10;
    switch(*(uint *)((long)pvVar1 + 0x10) >> 0xc & 3) {
    case 0:
      *(uint *)((long)pvVar1 + 0x1c) = *(uint *)((long)pvVar1 + 0x1c) & 0xffffe0ff;
      *(uint *)((long)pvVar1 + 0x1c) = *(uint *)((long)pvVar1 + 0x1c) & 0xffc0ffff;
      break;
    case 1:
    case 3:
      *(uint *)((long)pvVar1 + 0x1c) =
           *(uint *)((long)pvVar1 + 0x1c) & 0xffffe0ff | (syntax->nb_components * 6 - 1 & 0x1f) << 8
      ;
      break;
    case 2:
      *(uint *)((long)pvVar1 + 0x1c) =
           *(uint *)((long)pvVar1 + 0x1c) & 0xffffe0ff |
           ((syntax->nb_components - 1) * 6 - 1 & 0x1f) << 8;
      break;
    default:
      _mpp_log_l(2,"hal_jpegd_rkv","unsupported htable_sel %d\n","jpegd_gen_regs",
                 (ulong)(*(uint *)((long)pvVar1 + 0x10) >> 0xc & 3));
    }
    iVar4 = mpp_buffer_get_fd_with_caller(ctx->pTableBase,"jpegd_gen_regs");
    if (iVar4 == 0) {
      _mpp_log_l(2,"hal_jpegd_rkv","get table_fd failed\n","jpegd_gen_regs");
      ctx_local._4_4_ = MPP_NOK;
    }
    else {
      uVar2 = syntax->strm_offset;
      offset = uVar2 - (uVar2 & 0xf);
      *(uint *)((long)pvVar1 + 0x20) =
           *(uint *)((long)pvVar1 + 0x20) & 0xf |
           ((syntax->pkt_len - offset) + 0xf & 0xfffffff0) - 0x10;
      *(uint *)((long)pvVar1 + 0x20) =
           *(uint *)((long)pvVar1 + 0x20) & 0xfffffff0 | (uint)((byte)uVar2 & 0xf);
      *(int *)((long)pvVar1 + 0x24) = iVar4;
      *(int *)((long)pvVar1 + 0x28) = iVar4;
      *(int *)((long)pvVar1 + 0x2c) = iVar4;
      *(RK_S32 *)((long)pvVar1 + 0x34) = ctx->frame_fd;
      *(RK_S32 *)((long)pvVar1 + 0x30) = ctx->pkt_fd;
      mpp_dev_set_reg_offset(ctx->dev,0xc,offset);
      mpp_dev_set_reg_offset(ctx->dev,10,0x180);
      mpp_dev_set_reg_offset(ctx->dev,0xb,0x2c0);
      *(uint *)((long)pvVar1 + 0x38) = *(uint *)((long)pvVar1 + 0x38) & 0xfffffffe | 1;
      *(uint *)((long)pvVar1 + 0x38) = *(uint *)((long)pvVar1 + 0x38) & 0xffffff9f | 0x40;
      *(uint *)((long)pvVar1 + 0x38) = *(uint *)((long)pvVar1 + 0x38) & 0xfffffe7f | 0x100;
      *(uint *)((long)pvVar1 + 0x38) = *(uint *)((long)pvVar1 + 0x38) & 0xfffffdff;
      *(undefined4 *)((long)pvVar1 + 0x40) = 0xff;
      *(uint *)((long)pvVar1 + 0x78) = *(uint *)((long)pvVar1 + 0x78) & 0xfffffffe | 1;
      *(uint *)((long)pvVar1 + 0x78) = *(uint *)((long)pvVar1 + 0x78) & 0xfffffffd | 2;
      *(uint *)((long)pvVar1 + 0x78) = *(uint *)((long)pvVar1 + 0x78) & 0xfffffff7 | 8;
      *(uint *)((long)pvVar1 + 0x78) = *(uint *)((long)pvVar1 + 0x78) & 0xffffff0f | 0xa0;
      jpegd_write_rkv_htbl(ctx,syntax);
      jpegd_write_rkv_qtbl(ctx,syntax);
      if ((jpegd_debug & 1) != 0) {
        _mpp_log_l(4,"hal_jpegd_rkv","exit\n","jpegd_gen_regs");
      }
      ctx_local._4_4_ = MPP_OK;
    }
  }
  else {
    ctx_local._4_4_ = MPP_NOK;
  }
  return ctx_local._4_4_;
}

Assistant:

static
MPP_RET jpegd_gen_regs(JpegdHalCtx *ctx, JpegdSyntax *syntax)
{
    MPP_RET ret = MPP_OK;
    jpegd_dbg_func("enter\n");
    JpegdIocRegInfo *info = (JpegdIocRegInfo *)ctx->regs;
    JpegRegSet *reg = &(info->regs);
    JpegdSyntax *s = syntax;

    jpegd_regs_init(reg);

    reg->reg50_dec_ctrl.sw_filtering_dis = 1;
    reg->reg53_dec_mode = DEC_MODE_JPEG;

    reg->reg57_enable_ctrl.sw_dec_e = 1;  /* Enable jpeg mode */
    reg->reg57_enable_ctrl.sw_pjpeg_e = 0;
    reg->reg57_enable_ctrl.sw_dec_out_dis = 0;
    reg->reg57_enable_ctrl.sw_rlc_mode_e = 0;

    /* frame size, round up the number of mbs */
    reg->reg120.sw_pic_mb_h_ext = ((((s->ver_stride) >> (4)) & 0x700) >> 8);
    reg->reg120.sw_pic_mb_w_ext = ((((s->hor_stride) >> (4)) & 0xE00) >> 9);
    reg->reg120.sw_pic_mb_width = ((s->hor_stride) >> (4)) & 0x1FF;
    reg->reg120.sw_pic_mb_hight_p = ((s->ver_stride) >> (4)) & 0x0FF;

    reg->reg121.sw_pjpeg_fildown_e = s->fill_bottom;
    /* Set spectral selection start coefficient */
    reg->reg121.sw_pjpeg_ss = s->scan_start;
    /* Set spectral selection end coefficient */
    reg->reg121.sw_pjpeg_se = s->scan_end;
    /* Set the point transform used in the preceding scan */
    reg->reg121.sw_pjpeg_ah = s->prev_shift;
    /* Set the point transform value */
    reg->reg121.sw_pjpeg_al = s->point_transform;

    reg->reg122.sw_jpeg_qtables = s->qtable_cnt;
    reg->reg122.sw_jpeg_mode = s->yuv_mode;
    reg->reg122.sw_jpeg_filright_e = s->fill_right;

    reg->reg148.sw_slice_h = 0;
    /* Set bit 21 of reg148 to 1, notifying hardware to decode jpeg
     * including DRI segment
     */
    reg->reg148.sw_syn_marker_e = 1;

    /* tell hardware that height is 8-pixel aligned,
     * but not 16-pixel aligned
     */
    if ((s->height % 16) && ((s->height % 16) <= 8) &&
        (!ctx->pp_info.pp_enable) &&
        (s->yuv_mode == JPEGDEC_YUV422 ||
         s->yuv_mode == JPEGDEC_YUV444 ||
         s->yuv_mode == JPEGDEC_YUV411)) {
        reg->reg148.sw_jpeg_height8_flag = 1;
    }

    /* write VLC code word number to register */
    jpegd_write_code_word_number(ctx, s);

    /* Create AC/DC/QP tables for hardware */
    jpegd_write_qp_ac_dc_table(ctx, s);

    /* Select which tables the chromas use */
    jpegd_set_chroma_table_id(ctx, s);

    /* write table base */
    reg->reg61_qtable_base = mpp_buffer_get_fd(ctx->pTableBase);
    if (reg->reg61_qtable_base <= 0) {
        mpp_err_f("get qtable_base failed\n");
        return MPP_NOK;
    }
    /* set up stream position for HW decode */
    jpegd_set_stream_offset(ctx, s);

    /* set restart interval */
    if (s->restart_interval) {
        reg->reg122.sw_sync_marker_e = 1;
        /* If exists DRI segment, bit 0 to bit 15 of reg123 is set
         * to restart interval */
        reg->reg123.sw_pjpeg_rest_freq = s->restart_interval;
    } else {
        reg->reg122.sw_sync_marker_e = 0;
    }

    jpegd_setup_pp(ctx, syntax);

    jpegd_dbg_func("exit\n");
    return ret;
}